

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vauth.c
# Opt level: O0

char * Curl_auth_build_spn(char *service,char *host,char *realm)

{
  char *local_28;
  char *spn;
  char *realm_local;
  char *host_local;
  char *service_local;
  
  local_28 = (char *)0x0;
  if ((host == (char *)0x0) || (realm == (char *)0x0)) {
    if (host == (char *)0x0) {
      if (realm != (char *)0x0) {
        local_28 = curl_maprintf("%s@%s",service,realm);
      }
    }
    else {
      local_28 = curl_maprintf("%s/%s",service,host);
    }
  }
  else {
    local_28 = curl_maprintf("%s/%s@%s",service,host,realm);
  }
  return local_28;
}

Assistant:

char *Curl_auth_build_spn(const char *service, const char *host,
                          const char *realm)
{
  char *spn = NULL;

  /* Generate our SPN */
  if(host && realm)
    spn = aprintf("%s/%s@%s", service, host, realm);
  else if(host)
    spn = aprintf("%s/%s", service, host);
  else if(realm)
    spn = aprintf("%s@%s", service, realm);

  /* Return our newly allocated SPN */
  return spn;
}